

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void pop_scope(JSParseState *s)

{
  int iVar1;
  long in_RDI;
  int scope;
  JSParseState *unaff_retaddr;
  JSFunctionDef *fd;
  JSFunctionDef *fd_00;
  
  if (*(long *)(in_RDI + 0x68) != 0) {
    fd_00 = *(JSFunctionDef **)(in_RDI + 0x68);
    iVar1 = fd_00->scope_level;
    emit_op(unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38));
    emit_u16((JSParseState *)fd_00,(uint16_t)((uint)iVar1 >> 0x10));
    fd_00->scope_level = fd_00->scopes[iVar1].parent;
    iVar1 = get_first_lexical_var(fd_00,fd_00->scope_level);
    fd_00->scope_first = iVar1;
  }
  return;
}

Assistant:

static void pop_scope(JSParseState *s) {
    if (s->cur_func) {
        /* disable scoped variables */
        JSFunctionDef *fd = s->cur_func;
        int scope = fd->scope_level;
        emit_op(s, OP_leave_scope);
        emit_u16(s, scope);
        fd->scope_level = fd->scopes[scope].parent;
        fd->scope_first = get_first_lexical_var(fd, fd->scope_level);
    }
}